

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Editor.cpp
# Opt level: O3

bool __thiscall
Editor::textCommandEntered
          (Editor *this,string *input,int *currentLineNumber,LinkedList *list,bool *isInsert)

{
  command cVar1;
  int iVar2;
  int iVar3;
  byte bVar4;
  bool bVar5;
  Editor *pEVar6;
  int n;
  int m;
  string cmd;
  istringstream ss;
  int local_1d8;
  int local_1d4;
  undefined1 *local_1d0;
  undefined8 local_1c8;
  undefined1 local_1c0;
  undefined7 uStack_1bf;
  Editor local_1b0;
  ios_base local_138 [264];
  
  pEVar6 = &local_1b0;
  std::__cxx11::istringstream::istringstream((istringstream *)pEVar6,(string *)input,_S_in);
  local_1c8 = 0;
  local_1c0 = 0;
  local_1d8 = 0;
  local_1d4 = 0;
  local_1d0 = &local_1c0;
  cVar1 = checkCommand(pEVar6,input);
  switch(cVar1) {
  case cmdL:
    bVar5 = true;
    cmdList(pEVar6,list);
    break;
  case cmdLn:
    std::operator>>((istream *)&local_1b0,(string *)&local_1d0);
    pEVar6 = &local_1b0;
    std::istream::operator>>((istream *)pEVar6,&local_1d8);
    bVar5 = true;
    cmdList(pEVar6,local_1d8,list);
    break;
  case cmdLnm:
    std::operator>>((istream *)&local_1b0,(string *)&local_1d0);
    std::istream::operator>>((istream *)&local_1b0,&local_1d8);
    pEVar6 = &local_1b0;
    std::istream::operator>>((istream *)pEVar6,&local_1d4);
    bVar5 = true;
    cmdList(pEVar6,local_1d8,local_1d4,list);
    break;
  case cmdD:
    bVar5 = true;
    cmdDelete(pEVar6,currentLineNumber,list);
    break;
  case cmdDn:
    std::operator>>((istream *)&local_1b0,(string *)&local_1d0);
    pEVar6 = &local_1b0;
    std::istream::operator>>((istream *)pEVar6,&local_1d8);
    bVar5 = true;
    cmdDelete(pEVar6,local_1d8,currentLineNumber,list);
    break;
  case cmdDnm:
    std::operator>>((istream *)&local_1b0,(string *)&local_1d0);
    std::istream::operator>>((istream *)&local_1b0,&local_1d8);
    pEVar6 = &local_1b0;
    std::istream::operator>>((istream *)pEVar6,&local_1d4);
    bVar5 = true;
    cmdDelete(pEVar6,local_1d8,local_1d4,currentLineNumber,list);
    break;
  case cmdI:
    iVar3 = LinkedList::getLineCount(list);
    iVar3 = iVar3 + (uint)*isInsert;
    bVar4 = *isInsert ^ 1;
    goto LAB_0010545e;
  case cmdIn:
    std::operator>>((istream *)&local_1b0,(string *)&local_1d0);
    std::istream::operator>>((istream *)&local_1b0,&local_1d8);
    iVar3 = local_1d8;
    iVar2 = LinkedList::getLineCount(list);
    bVar5 = true;
    if ((iVar3 < 1) || (iVar2 < iVar3)) break;
    bVar5 = true;
    bVar4 = true;
    if (*isInsert != false) break;
LAB_0010545e:
    *isInsert = (bool)bVar4;
    *currentLineNumber = iVar3;
    bVar5 = true;
    break;
  default:
    bVar5 = false;
  }
  if (local_1d0 != &local_1c0) {
    operator_delete(local_1d0,CONCAT71(uStack_1bf,local_1c0) + 1);
  }
  std::__cxx11::istringstream::~istringstream((istringstream *)&local_1b0);
  std::ios_base::~ios_base(local_138);
  return bVar5;
}

Assistant:

bool Editor::textCommandEntered(const std::string &input, int *currentLineNumber, LinkedList *list, bool *isInsert) {

    // Define string stream and variables to parse the command into it's letter and int value(s).
    // Adapted from: https://www.geeksforgeeks.org/split-a-sentence-into-words-in-cpp/
    std::istringstream ss(input);
    std::string cmd;
    int n = 0;
    int m = 0;

    // Check if the input is a command, parse the command, call the corresponding function.
    switch (checkCommand(input)) {
        case cmdL:

            // Call the List command
            cmdList(list);

            return true;

        case cmdLn:

            // Retrieve the command and the number(s) from the string stream
            ss >> cmd;
            ss >> n;

            // Call the corresponding function
            cmdList(n, list);

            return true;

        case cmdLnm:
            ss >> cmd;
            ss >> n;
            ss >> m;
            cmdList(n, m, list);
            return true;
        case cmdD:
            cmdDelete(currentLineNumber, list);
            return true;
        case cmdDn:
            ss >> cmd;
            ss >> n;
            cmdDelete(n, currentLineNumber, list);
            return true;
        case cmdDnm:
            ss >> cmd;
            ss >> n;
            ss >> m;
            cmdDelete(n, m, currentLineNumber, list);
            return true;
        case cmdI:
            cmdInsert(currentLineNumber, list, isInsert);
            return true;
        case cmdIn:
            ss >> cmd;
            ss >> n;
            cmdInsert(n, currentLineNumber, list, isInsert);
            return true;
        default:
            return false; // Input is not a valid command
    }
}